

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void __thiscall ValTypeLattice_Meet_Test::~ValTypeLattice_Meet_Test(ValTypeLattice_Meet_Test *this)

{
  ValTypeLattice_Meet_Test *this_local;
  
  ~ValTypeLattice_Meet_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ValTypeLattice, Meet) {
  analysis::ValType valtype;
  testDiamondMeet(valtype, Type::unreachable, Type::i32, Type::f32, Type::none);
  testDiamondMeet(valtype,
                  Type(HeapType::none, NonNullable),
                  Type(HeapType::struct_, NonNullable),
                  Type(HeapType::array, Nullable),
                  Type(HeapType::eq, Nullable));
}